

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O0

void av1_iadst4(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int n;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t *piVar13;
  long in_RCX;
  char in_DL;
  int32_t *in_RSI;
  int *in_RDI;
  int32_t x3;
  int32_t x2;
  int32_t x1;
  int32_t x0;
  int32_t s7;
  int32_t s6;
  int32_t s5;
  int32_t s4;
  int32_t s3;
  int32_t s2;
  int32_t s1;
  int32_t s0;
  int32_t *sinpi;
  int bit;
  
  n = (int)in_DL;
  piVar13 = sinpi_arr(n);
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[2];
  iVar4 = in_RDI[3];
  if (((iVar1 == 0 && iVar2 == 0) && iVar3 == 0) && iVar4 == 0) {
    in_RSI[3] = 0;
    in_RSI[2] = 0;
    in_RSI[1] = 0;
    *in_RSI = 0;
  }
  else {
    iVar5 = range_check_value(piVar13[1] * iVar1,*(char *)(in_RCX + 1) + in_DL);
    iVar6 = range_check_value(piVar13[2] * iVar1,*(char *)(in_RCX + 1) + in_DL);
    iVar7 = range_check_value(piVar13[3] * iVar2,*(char *)(in_RCX + 1) + in_DL);
    iVar8 = range_check_value(piVar13[4] * iVar3,*(char *)(in_RCX + 1) + in_DL);
    iVar9 = range_check_value(piVar13[1] * iVar3,*(char *)(in_RCX + 1) + in_DL);
    iVar10 = range_check_value(piVar13[2] * iVar4,*(char *)(in_RCX + 1) + in_DL);
    iVar11 = range_check_value(piVar13[4] * iVar4,*(char *)(in_RCX + 1) + in_DL);
    iVar12 = range_check_value((iVar1 - iVar3) + iVar4,*(int8_t *)(in_RCX + 2));
    iVar5 = range_check_value(iVar5 + iVar8,*(char *)(in_RCX + 3) + in_DL);
    iVar6 = range_check_value(iVar6 - iVar9,*(char *)(in_RCX + 3) + in_DL);
    iVar7 = range_check_value(iVar7,*(char *)(in_RCX + 3) + in_DL);
    iVar8 = range_check_value(piVar13[3] * iVar12,*(char *)(in_RCX + 3) + in_DL);
    iVar5 = range_check_value(iVar5 + iVar10,*(char *)(in_RCX + 4) + in_DL);
    iVar6 = range_check_value(iVar6 - iVar11,*(char *)(in_RCX + 4) + in_DL);
    iVar9 = range_check_value(iVar5 + iVar7,*(char *)(in_RCX + 5) + in_DL);
    iVar10 = range_check_value(iVar6 + iVar7,*(char *)(in_RCX + 5) + in_DL);
    iVar8 = range_check_value(iVar8,*(char *)(in_RCX + 5) + in_DL);
    iVar5 = range_check_value(iVar5 + iVar6,*(char *)(in_RCX + 5) + in_DL);
    iVar5 = range_check_value(iVar5 - iVar7,*(char *)(in_RCX + 6) + in_DL);
    iVar6 = round_shift((long)iVar9,n);
    *in_RSI = iVar6;
    iVar6 = round_shift((long)iVar10,n);
    in_RSI[1] = iVar6;
    iVar6 = round_shift((long)iVar8,n);
    in_RSI[2] = iVar6;
    iVar5 = round_shift((long)iVar5,n);
    in_RSI[3] = iVar5;
  }
  return;
}

Assistant:

void av1_iadst4(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  int bit = cos_bit;
  const int32_t *sinpi = sinpi_arr(bit);
  int32_t s0, s1, s2, s3, s4, s5, s6, s7;

  int32_t x0 = input[0];
  int32_t x1 = input[1];
  int32_t x2 = input[2];
  int32_t x3 = input[3];

  if (!(x0 | x1 | x2 | x3)) {
    output[0] = output[1] = output[2] = output[3] = 0;
    return;
  }

  assert(sinpi[1] + sinpi[2] == sinpi[4]);

  // stage 1
  s0 = range_check_value(sinpi[1] * x0, stage_range[1] + bit);
  s1 = range_check_value(sinpi[2] * x0, stage_range[1] + bit);
  s2 = range_check_value(sinpi[3] * x1, stage_range[1] + bit);
  s3 = range_check_value(sinpi[4] * x2, stage_range[1] + bit);
  s4 = range_check_value(sinpi[1] * x2, stage_range[1] + bit);
  s5 = range_check_value(sinpi[2] * x3, stage_range[1] + bit);
  s6 = range_check_value(sinpi[4] * x3, stage_range[1] + bit);

  // stage 2
  // NOTICE: (x0 - x2) here may use one extra bit compared to the
  // opt_range_row/col specified in av1_gen_inv_stage_range()
  s7 = range_check_value((x0 - x2) + x3, stage_range[2]);

  // stage 3
  s0 = range_check_value(s0 + s3, stage_range[3] + bit);
  s1 = range_check_value(s1 - s4, stage_range[3] + bit);
  s3 = range_check_value(s2, stage_range[3] + bit);
  s2 = range_check_value(sinpi[3] * s7, stage_range[3] + bit);

  // stage 4
  s0 = range_check_value(s0 + s5, stage_range[4] + bit);
  s1 = range_check_value(s1 - s6, stage_range[4] + bit);

  // stage 5
  x0 = range_check_value(s0 + s3, stage_range[5] + bit);
  x1 = range_check_value(s1 + s3, stage_range[5] + bit);
  x2 = range_check_value(s2, stage_range[5] + bit);
  x3 = range_check_value(s0 + s1, stage_range[5] + bit);

  // stage 6
  x3 = range_check_value(x3 - s3, stage_range[6] + bit);

  output[0] = round_shift(x0, bit);
  output[1] = round_shift(x1, bit);
  output[2] = round_shift(x2, bit);
  output[3] = round_shift(x3, bit);
}